

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O0

int format_hyp(char *outptr,int len,ps_endpointer_t *ep,ps_decoder_t *decoder)

{
  int32 logb_p;
  int iVar1;
  logmath_t *lmath_00;
  ps_config_t *config;
  long lVar2;
  float64 fVar3;
  char *local_50;
  char *hyp;
  double et;
  double st;
  double prob;
  logmath_t *lmath;
  ps_decoder_t *decoder_local;
  ps_endpointer_t *ep_local;
  int len_local;
  char *outptr_local;
  
  lmath_00 = ps_get_logmath(decoder);
  logb_p = ps_get_prob(decoder);
  fVar3 = logmath_exp(lmath_00,logb_p);
  if (ep == (ps_endpointer_t *)0x0) {
    et = 0.0;
    iVar1 = ps_get_n_frames(decoder);
    config = ps_get_config(decoder);
    lVar2 = ps_config_int(config,"frate");
    hyp = (char *)((double)iVar1 / (double)lVar2);
  }
  else {
    et = ps_endpointer_speech_start(ep);
    hyp = (char *)ps_endpointer_speech_end(ep);
  }
  local_50 = ps_get_hyp(decoder,(int32 *)0x0);
  if (local_50 == (char *)0x0) {
    local_50 = "";
  }
  iVar1 = snprintf(outptr,(long)len,"{\"b\":%.3f,\"d\":%.3f,\"p\":%.3f,\"t\":\"%s\"",et,
                   (double)hyp - et,fVar3,local_50);
  return iVar1;
}

Assistant:

static int
format_hyp(char *outptr, int len, ps_endpointer_t *ep, ps_decoder_t *decoder)
{
    logmath_t *lmath;
    double prob, st, et;
    const char *hyp;

    lmath = ps_get_logmath(decoder);
    prob = logmath_exp(lmath, ps_get_prob(decoder));
    if (ep == NULL) {
        st = 0.0;
        et = (double)ps_get_n_frames(decoder)
            / ps_config_int(ps_get_config(decoder), "frate");
    }
    else {
        st = ps_endpointer_speech_start(ep);
        et = ps_endpointer_speech_end(ep);
    }
    hyp = ps_get_hyp(decoder, NULL);
    if (hyp == NULL)
        hyp = "";
    return snprintf(outptr, len, HYP_FORMAT, st, et - st, prob, hyp);
}